

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

Optional<unsigned_int> __thiscall Catch::parseUInt(Catch *this,string *input,int base)

{
  unsigned_long_long uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  unsigned_long_long uVar5;
  undefined8 extraout_RDX;
  Optional<unsigned_int> OVar6;
  invalid_argument *anon_var_0;
  out_of_range *anon_var_0_1;
  ulong local_60;
  unsigned_long_long ret;
  size_t pos;
  undefined1 local_40 [8];
  string trimmed;
  int base_local;
  string *input_local;
  
  trimmed.field_2._12_4_ = base;
  trim((string *)local_40,input);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar4 != '-') {
      ret = 0;
      local_60 = std::__cxx11::stoull((string *)local_40,&ret,trimmed.field_2._12_4_);
      uVar1 = ret;
      uVar5 = std::__cxx11::string::size();
      uVar3 = local_60;
      if (uVar1 == uVar5) {
        uVar2 = std::numeric_limits<unsigned_int>::max();
        if (uVar2 < uVar3) {
          Optional<unsigned_int>::Optional((Optional<unsigned_int> *)this);
        }
        else {
          anon_var_0_1._4_4_ = (undefined4)local_60;
          Optional<unsigned_int>::Optional
                    ((Optional<unsigned_int> *)this,(uint *)((long)&anon_var_0_1 + 4));
        }
      }
      else {
        Optional<unsigned_int>::Optional((Optional<unsigned_int> *)this);
      }
      goto LAB_00137eaf;
    }
  }
  Optional<unsigned_int>::Optional((Optional<unsigned_int> *)this);
LAB_00137eaf:
  pos._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_40);
  OVar6.storage[0] = (char)extraout_RDX;
  OVar6.storage[1] = (char)((ulong)extraout_RDX >> 8);
  OVar6.storage[2] = (char)((ulong)extraout_RDX >> 0x10);
  OVar6.storage[3] = (char)((ulong)extraout_RDX >> 0x18);
  OVar6._12_4_ = (int)((ulong)extraout_RDX >> 0x20);
  OVar6.nullableValue = (uint *)this;
  return OVar6;
}

Assistant:

Optional<unsigned int> parseUInt(std::string const& input, int base) {
        auto trimmed = trim( input );
        // std::stoull is annoying and accepts numbers starting with '-',
        // it just negates them into unsigned int
        if ( trimmed.empty() || trimmed[0] == '-' ) {
            return {};
        }

        CATCH_TRY {
            size_t pos = 0;
            const auto ret = std::stoull( trimmed, &pos, base );

            // We did not consume the whole input, so there is an issue
            // This can be bunch of different stuff, like multiple numbers
            // in the input, or invalid digits/characters and so on. Either
            // way, we do not want to return the partially parsed result.
            if ( pos != trimmed.size() ) {
                return {};
            }
            // Too large
            if ( ret > std::numeric_limits<unsigned int>::max() ) {
                return {};
            }
            return static_cast<unsigned int>(ret);
        }